

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_PCM.cpp
# Opt level: O0

h__Reader * __thiscall
ASDCP::PCM::MXFReader::h__Reader::ReadFrame
          (h__Reader *this,ui32_t FrameNum,FrameBuffer *FrameBuf,AESDecContext *Ctx,
          HMACContext *HMAC)

{
  ulong uVar1;
  AESDecContext *Ctx_00;
  undefined4 in_register_00000034;
  long lVar2;
  HMACContext *HMAC_local;
  AESDecContext *Ctx_local;
  FrameBuffer *FrameBuf_local;
  ui32_t FrameNum_local;
  h__Reader *this_local;
  
  lVar2 = CONCAT44(in_register_00000034,FrameNum);
  uVar1 = (**(code **)(**(long **)(lVar2 + 0x10) + 0x40))();
  if ((uVar1 & 1) == 0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  }
  else if (*(uint *)(lVar2 + 0x680) < (int)FrameBuf + 1U) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_RANGE);
  }
  else {
    if (*(long *)(lVar2 + 8) == 0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_PCM.cpp"
                    ,0x15e,
                    "ASDCP::Result_t ASDCP::PCM::MXFReader::h__Reader::ReadFrame(ui32_t, FrameBuffer &, AESDecContext *, HMACContext *)"
                   );
    }
    Ctx_00 = (AESDecContext *)Dictionary::ul(*(Dictionary **)(lVar2 + 8),MDD_WAVEssence);
    h__ASDCPReader::ReadEKLVFrame
              (&this->super_h__ASDCPReader,FrameNum,(FrameBuffer *)((ulong)FrameBuf & 0xffffffff),
               (byte_t *)Ctx,Ctx_00,HMAC);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::PCM::MXFReader::h__Reader::ReadFrame(ui32_t FrameNum, FrameBuffer& FrameBuf,
					    AESDecContext* Ctx, HMACContext* HMAC)
{
  if ( ! m_File->IsOpen() )
    return RESULT_INIT;

  if ( (FrameNum+1) > m_ADesc.ContainerDuration )
    {
      return RESULT_RANGE;
    }

  assert(m_Dict);
  return ReadEKLVFrame(FrameNum, FrameBuf, m_Dict->ul(MDD_WAVEssence), Ctx, HMAC);
}